

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

int __thiscall
OpenSSLWrapper::SslConnection::ShutDownConnection(SslConnection *this,int *iErrorHint)

{
  int iVar1;
  runtime_error *this_00;
  wchar_t *pOut;
  char *pOut_00;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  wstring local_138;
  wstring local_118;
  wstring local_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  int local_34;
  int iError;
  lock_guard<std::mutex> lk;
  int *iErrorHint_local;
  SslConnection *this_local;
  
  if (this->m_ssl != (SSL *)0x0) {
    if (this->m_iShutDownFlag < 1) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&stack0xffffffffffffffd0,&this->m_mxSsl);
      iVar1 = SSL_shutdown((SSL *)this->m_ssl);
      this->m_iShutDownFlag = iVar1;
      if (this->m_iShutDownFlag < 0) {
        local_34 = SSL_get_error((SSL *)this->m_ssl,this->m_iShutDownFlag);
        if (iErrorHint != (int *)0x0) {
          *iErrorHint = local_34;
        }
        if (local_34 != 2) {
          std::__cxx11::to_wstring(&local_f8,this->m_iShutDownFlag);
          std::operator+(&local_d8,L"SSL_shutdown code: ",&local_f8);
          std::operator+(&local_b8,&local_d8,L" Error-Code: ");
          std::__cxx11::to_wstring(&local_118,local_34);
          std::operator+(&local_98,&local_b8,&local_118);
          std::operator+(&local_78,&local_98,L" on ssl context: ");
          std::__cxx11::to_wstring(&local_138,(unsigned_long)this->m_ssl);
          std::operator+(&local_58,&local_78,&local_138);
          pOut = (wchar_t *)std::__cxx11::wstring::c_str();
          OutputDebugString(pOut);
          std::__cxx11::wstring::~wstring((wstring *)&local_58);
          std::__cxx11::wstring::~wstring((wstring *)&local_138);
          std::__cxx11::wstring::~wstring((wstring *)&local_78);
          std::__cxx11::wstring::~wstring((wstring *)&local_98);
          std::__cxx11::wstring::~wstring((wstring *)&local_118);
          std::__cxx11::wstring::~wstring((wstring *)&local_b8);
          std::__cxx11::wstring::~wstring((wstring *)&local_d8);
          std::__cxx11::wstring::~wstring((wstring *)&local_f8);
          GetSslErrAsString_abi_cxx11_(&local_178,this);
          std::operator+(&local_158,", msg: ",&local_178);
          pOut_00 = (char *)std::__cxx11::string::c_str();
          OutputDebugStringA(pOut_00);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd0);
    }
    return this->m_iShutDownFlag;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Not Initialized");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int SslConnection::ShutDownConnection(int* iErrorHint/* = nullptr*/)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        if (m_iShutDownFlag < 1)
        {
            lock_guard<mutex> lk(m_mxSsl);

            m_iShutDownFlag = SSL_shutdown(m_ssl);
            if (m_iShutDownFlag < 0)
            {
                int iError = SSL_get_error(m_ssl, m_iShutDownFlag);
                if (iErrorHint != nullptr)
                    *iErrorHint = iError;
                if (iError != SSL_ERROR_WANT_READ)
                {
                    OutputDebugString(wstring(L"SSL_shutdown code: " + to_wstring(m_iShutDownFlag) + L" Error-Code: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>(m_ssl))).c_str());
                    OutputDebugStringA(string(", msg: " + GetSslErrAsString()).c_str());
                }
            }
        }
        return m_iShutDownFlag;
    }